

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int ReconstructIntra16(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  VP8Encoder *enc;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  int16_t (*paiVar6) [16];
  ulong uVar7;
  long lVar8;
  int16_t (*paiVar9) [16];
  uint16_t *puVar10;
  long lVar11;
  long lVar12;
  uint local_28c;
  long local_288;
  int16_t dc_tmp [16];
  int16_t tmp [16] [16];
  
  puVar2 = it->yuv_in_;
  enc = it->enc_;
  uVar1 = VP8I16ModeOffsets[mode];
  puVar3 = it->yuv_p_;
  uVar4 = *(byte *)it->mb_ >> 5 & 3;
  paiVar6 = tmp;
  puVar10 = VP8Scan;
  for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 2) {
    (*VP8FTransform2)(puVar2 + *puVar10,puVar3 + (ulong)*puVar10 + (ulong)uVar1,*paiVar6);
    paiVar6 = paiVar6 + 2;
    puVar10 = puVar10 + 2;
  }
  (*VP8FTransformWHT)(tmp[0],dc_tmp);
  iVar5 = (*VP8EncQuantizeBlockWHT)(dc_tmp,rd->y_dc_levels,&enc->dqm_[uVar4].y2_);
  local_28c = iVar5 << 0x18;
  if (it->do_trellis_ == 0) {
    paiVar9 = rd->y_ac_levels;
    paiVar6 = tmp;
    for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 2) {
      paiVar6[1][0] = 0;
      (*paiVar6)[0] = 0;
      iVar5 = (*VP8EncQuantize2Blocks)(*paiVar6,*paiVar9,&enc->dqm_[uVar4].y1_);
      local_28c = local_28c | iVar5 << ((byte)uVar7 & 0x1f);
      paiVar9 = paiVar9 + 2;
      paiVar6 = paiVar6 + 2;
    }
  }
  else {
    VP8IteratorNzToBytes(it);
    local_288 = 0;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      lVar12 = (long)(int)local_288;
      paiVar9 = tmp + lVar12;
      paiVar6 = rd->y_ac_levels + lVar12;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        iVar5 = TrellisQuantizeBlock
                          (enc,*paiVar9,*paiVar6,it->left_nz_[lVar11] + it->top_nz_[lVar8],0,
                           &enc->dqm_[uVar4].y1_,enc->dqm_[uVar4].lambda_trellis_i16_);
        it->left_nz_[lVar11] = iVar5;
        it->top_nz_[lVar8] = iVar5;
        (*paiVar6)[0] = 0;
        local_28c = local_28c | iVar5 << ((char)local_288 + (char)lVar8 & 0x1fU);
        paiVar9 = paiVar9 + 1;
        paiVar6 = paiVar6 + 1;
      }
      local_288 = lVar12 + 4;
    }
  }
  paiVar6 = tmp;
  (*VP8TransformWHT)(dc_tmp,*paiVar6);
  puVar10 = VP8Scan;
  for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 2) {
    (*VP8ITransform)(puVar3 + (ulong)*puVar10 + (ulong)uVar1,*paiVar6,yuv_out + *puVar10,1);
    paiVar6 = paiVar6 + 2;
    puVar10 = puVar10 + 2;
  }
  return local_28c;
}

Assistant:

static int ReconstructIntra16(VP8EncIterator* WEBP_RESTRICT const it,
                              VP8ModeScore* WEBP_RESTRICT const rd,
                              uint8_t* WEBP_RESTRICT const yuv_out,
                              int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I16ModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + Y_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[16][16], dc_tmp[16];

  for (n = 0; n < 16; n += 2) {
    VP8FTransform2(src + VP8Scan[n], ref + VP8Scan[n], tmp[n]);
  }
  VP8FTransformWHT(tmp[0], dc_tmp);
  nz |= VP8EncQuantizeBlockWHT(dc_tmp, rd->y_dc_levels, &dqm->y2_) << 24;

  if (DO_TRELLIS_I16 && it->do_trellis_) {
    int x, y;
    VP8IteratorNzToBytes(it);
    for (y = 0, n = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x, ++n) {
        const int ctx = it->top_nz_[x] + it->left_nz_[y];
        const int non_zero = TrellisQuantizeBlock(
            enc, tmp[n], rd->y_ac_levels[n], ctx, TYPE_I16_AC, &dqm->y1_,
            dqm->lambda_trellis_i16_);
        it->top_nz_[x] = it->left_nz_[y] = non_zero;
        rd->y_ac_levels[n][0] = 0;
        nz |= non_zero << n;
      }
    }
  } else {
    for (n = 0; n < 16; n += 2) {
      // Zero-out the first coeff, so that: a) nz is correct below, and
      // b) finding 'last' non-zero coeffs in SetResidualCoeffs() is simplified.
      tmp[n][0] = tmp[n + 1][0] = 0;
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->y_ac_levels[n], &dqm->y1_) << n;
      assert(rd->y_ac_levels[n + 0][0] == 0);
      assert(rd->y_ac_levels[n + 1][0] == 0);
    }
  }

  // Transform back
  VP8TransformWHT(dc_tmp, tmp[0]);
  for (n = 0; n < 16; n += 2) {
    VP8ITransform(ref + VP8Scan[n], tmp[n], yuv_out + VP8Scan[n], 1);
  }

  return nz;
}